

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_allocator_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::NoPropagateOnCopy_CopyConstructor_Test::
~NoPropagateOnCopy_CopyConstructor_Test(NoPropagateOnCopy_CopyConstructor_Test *this)

{
  NoPropagateOnCopy_CopyConstructor_Test *this_local;
  
  ~NoPropagateOnCopy_CopyConstructor_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(NoPropagateOnCopy, CopyConstructor) {
  auto it = t1.insert(0).first;
  Table u(t1);
  EXPECT_EQ(1, a1.num_allocs());
  EXPECT_EQ(1, u.get_allocator().num_allocs());
  EXPECT_EQ(0, it->num_moves());
  EXPECT_EQ(1, it->num_copies());
}